

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O0

void __thiscall HighsCutPool::resetAge(HighsCutPool *this,HighsInt cut)

{
  bool bVar1;
  reference pvVar2;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  pair<short,_int> pVar3;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar4;
  int in_ESI;
  long in_RDI;
  key_type *in_stack_ffffffffffffffb8;
  HighsDynamicRowMatrix *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  uint uVar5;
  pair<int,_int> local_14;
  int local_c;
  
  local_c = in_ESI;
  pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x168),(long)in_ESI);
  if (0 < *pvVar2) {
    bVar1 = HighsDynamicRowMatrix::columnsLinked
                      (in_stack_ffffffffffffffc0,
                       (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (bVar1) {
      this_00 = (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 *)(in_RDI + 0x218);
      std::vector<short,_std::allocator<short>_>::operator[]
                ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x168),(long)local_c);
      pVar3 = std::make_pair<short&,int&>((short *)in_stack_ffffffffffffffb8,(int *)0x5d382c);
      uVar5 = pVar3._0_4_;
      std::pair<int,_int>::pair<short,_int,_true>
                (&local_14,(pair<short,_int> *)&stack0xffffffffffffffe4);
      std::
      set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::erase(this_00,in_stack_ffffffffffffffb8);
      std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::emplace<int,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                           *)((ulong)uVar5 << 0x20),
                          (int *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0);
    }
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x278);
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x168),(long)local_c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)*pvVar2);
    *pvVar4 = *pvVar4 + -1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278),0);
    *pvVar4 = *pvVar4 + 1;
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x168),(long)local_c);
    *pvVar2 = 0;
  }
  return;
}

Assistant:

void resetAge(HighsInt cut) {
    if (ages_[cut] > 0) {
      if (matrix_.columnsLinked(cut)) {
        propRows.erase(std::make_pair(ages_[cut], cut));
        propRows.emplace(0, cut);
      }
      ageDistribution[ages_[cut]] -= 1;
      ageDistribution[0] += 1;
      ages_[cut] = 0;
    }
  }